

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint32_t svb_select_avx_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint32_t uVar9;
  xmm_t *PrevLow_00;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint in_ECX;
  uint uVar13;
  ulong uVar14;
  ulong in_RDX;
  xmm_t *palVar15;
  xmm_t *PrevHi_00;
  xmm_t *PrevHi_01;
  xmm_t *PrevHi_02;
  xmm_t *extraout_RDX;
  xmm_t *PrevHi_03;
  xmm_t *PrevHi_04;
  xmm_t *PrevHi_05;
  undefined1 (*in_RSI) [16];
  undefined1 (**ppauVar16) [16];
  long in_RDI;
  int in_R8D;
  xmm_t Vec;
  xmm_t Vec_00;
  xmm_t Vec_01;
  xmm_t Vec_02;
  xmm_t Vec_03;
  xmm_t Vec_04;
  xmm_t Vec_05;
  xmm_t Vec_06;
  xmm_t Vec_07;
  xmm_t Vec_08;
  xmm_t Vec_09;
  xmm_t Vec_10;
  xmm_t Vec_11;
  xmm_t Vec_12;
  xmm_t Vec_13;
  xmm_t Vec_14;
  xmm_t Vec_15;
  xmm_t Vec_16;
  xmm_t Vec_17;
  xmm_t Vec_18;
  xmm_t Vec_19;
  xmm_t Vec_20;
  xmm_t Vec_21;
  xmm_t alVar17;
  xmm_t Prev;
  xmm_t Prev_00;
  xmm_t Prev_01;
  xmm_t Prev_02;
  xmm_t Prev_03;
  xmm_t Prev_04;
  xmm_t Prev_05;
  xmm_t Prev_06;
  xmm_t Prev_07;
  xmm_t Prev_08;
  xmm_t Prev_09;
  xmm_t Prev_10;
  xmm_t Prev_11;
  xmm_t Prev_12;
  xmm_t Prev_13;
  xmm_t Prev_14;
  uint32_t keysleft;
  uint64_t consumedkeys;
  uint64_t keys_1;
  uint64_t keys;
  uint64_t nextkeys;
  uint64_t *keyPtr64;
  int64_t Offset;
  xmm_t Data;
  xmm_t PrevLow;
  xmm_t PrevHi;
  int consumedInts;
  uint64_t keybytes;
  uint8_t *in_stack_fffffffffffffe60;
  uint8_t *in_stack_fffffffffffffe68;
  uint8_t *in_stack_fffffffffffffe70;
  uint8_t *puVar18;
  xmm_t *local_180;
  longlong local_178;
  longlong lStack_170;
  longlong local_168;
  longlong lStack_160;
  longlong local_158;
  undefined8 uStack_150;
  int local_13c;
  ulong local_138;
  int local_130;
  uint local_12c;
  undefined1 (*local_120 [3]) [16];
  ulong local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 (*local_80) [16];
  undefined1 (*local_78) [16];
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  undefined1 (*local_60) [16];
  undefined1 (*local_58) [16];
  undefined1 (*local_50) [16];
  ulong local_48;
  undefined8 uStack_40;
  ulong *local_30;
  undefined1 local_28 [16];
  
  local_138 = in_RDX >> 2;
  local_13c = 0;
  local_12c = in_ECX;
  local_120[0] = in_RSI;
  if (7 < local_138) {
    auVar8 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar8 = vpinsrd_avx(auVar8,in_ECX,2);
    local_28 = vpinsrd_avx(auVar8,in_ECX,3);
    local_158 = local_28._0_8_;
    uStack_150 = local_28._8_8_;
    palVar15 = (xmm_t *)((long)-local_138 % 8);
    PrevLow_00 = (xmm_t *)((long)-local_138 / 8 + 1);
    lVar10 = in_RDI + (long)PrevLow_00 * -8;
    local_178 = local_28._0_8_;
    lStack_170 = local_28._8_8_;
    in_stack_fffffffffffffe60 = *(uint8_t **)(lVar10 + (long)PrevLow_00 * 8);
    local_130 = in_R8D;
    for (local_180 = PrevLow_00; local_180 != (xmm_t *)0x0;
        local_180 = (xmm_t *)((long)*local_180 + 1)) {
      puVar18 = *(uint8_t **)(lVar10 + 8 + (long)local_180 * 8);
      if (in_stack_fffffffffffffe60 == (uint8_t *)0x0) {
        local_50 = local_120[0];
        local_98 = vlddqu_avx(*local_120[0]);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_98._0_8_;
        vpmovzxbw_avx(auVar8);
        Vec[1] = (longlong)&local_168;
        Vec[0] = (longlong)&local_158;
        _scan_16bit_avx_d1(Vec,palVar15,local_180);
        if (local_130 < (int)(local_13c + 8U)) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,local_130 - local_13c);
          return uVar9;
        }
        local_58 = (undefined1 (*) [16])(*local_120[0] + 8);
        local_a8 = vlddqu_avx(*local_58);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_a8._0_8_;
        vpmovzxbw_avx(auVar1);
        Vec_00[1] = (longlong)&local_168;
        Vec_00[0] = (longlong)&local_158;
        _scan_16bit_avx_d1(Vec_00,PrevHi_00,(xmm_t *)(ulong)(local_13c + 8U));
        if (local_130 < (int)(local_13c + 0x10U)) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                    local_130 - (local_13c + 8));
          return uVar9;
        }
        local_60 = local_120[0] + 1;
        local_b8 = vlddqu_avx(*local_60);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_b8._0_8_;
        vpmovzxbw_avx(auVar2);
        Vec_01[1] = (longlong)&local_168;
        Vec_01[0] = (longlong)&local_158;
        _scan_16bit_avx_d1(Vec_01,PrevHi_01,(xmm_t *)(ulong)(local_13c + 0x10U));
        if (local_130 < (int)(local_13c + 0x18U)) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                    local_130 - (local_13c + 0x10));
          return uVar9;
        }
        local_68 = (undefined1 (*) [16])(local_120[0][1] + 8);
        local_c8 = vlddqu_avx(*local_68);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_c8._0_8_;
        auVar8 = vpmovzxbw_avx(auVar3);
        local_178 = auVar8._0_8_;
        lStack_170 = auVar8._8_8_;
        Vec_02[1] = (longlong)&local_168;
        Vec_02[0] = (longlong)&local_158;
        _scan_16bit_avx_d1(Vec_02,PrevHi_02,(xmm_t *)(ulong)(local_13c + 0x18U));
        uVar13 = local_13c + 0x20;
        if (local_130 < (int)uVar13) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                    local_130 - (local_13c + 0x18));
          return uVar9;
        }
        local_120[0] = local_120[0] + 2;
        palVar15 = extraout_RDX;
      }
      else {
        uVar13 = (uint)in_stack_fffffffffffffe60 & 0xff;
        uVar14 = (ulong)uVar13;
        ppauVar16 = local_120;
        palVar15 = local_180;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev[0] = alVar17[1];
        alVar17[1] = (longlong)ppauVar16;
        alVar17[0] = uVar14;
        Prev[1] = (longlong)palVar15;
        _scan_avx_d1(alVar17,Prev);
        uVar13 = (uint)((ulong)in_stack_fffffffffffffe60 >> 8) & 0xff;
        uVar14 = (ulong)uVar13;
        ppauVar16 = local_120;
        local_168 = local_178;
        lStack_160 = lStack_170;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_00[0] = alVar17[1];
        Vec_03[1] = (longlong)ppauVar16;
        Vec_03[0] = uVar14;
        Prev_00[1] = (longlong)palVar15;
        _scan_avx_d1(Vec_03,Prev_00);
        uVar14 = (ulong)(local_13c + 8U);
        local_158 = local_178;
        uStack_150 = lStack_170;
        if (local_130 < (int)(local_13c + 8U)) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,local_130 - local_13c);
          return uVar9;
        }
        uVar11 = (ulong)in_stack_fffffffffffffe60 >> 0x10;
        uVar13 = (uint)((ulong)in_stack_fffffffffffffe60 >> 0x10) & 0xff;
        uVar12 = (ulong)uVar13;
        ppauVar16 = local_120;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_01[0] = alVar17[1];
        Vec_04[1] = (longlong)ppauVar16;
        Vec_04[0] = uVar12;
        Prev_01[1] = uVar14;
        _scan_avx_d1(Vec_04,Prev_01);
        uVar13 = (uint)(uVar11 >> 8) & 0xff;
        uVar12 = (ulong)uVar13;
        ppauVar16 = local_120;
        local_168 = local_178;
        lStack_160 = lStack_170;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_02[0] = alVar17[1];
        Vec_05[1] = (longlong)ppauVar16;
        Vec_05[0] = uVar12;
        Prev_02[1] = uVar14;
        _scan_avx_d1(Vec_05,Prev_02);
        uVar14 = (ulong)(local_13c + 0x10U);
        local_158 = local_178;
        uStack_150 = lStack_170;
        if (local_130 < (int)(local_13c + 0x10U)) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                    local_130 - (local_13c + 8));
          return uVar9;
        }
        uVar12 = uVar11 >> 0x10;
        uVar13 = (uint)(uVar11 >> 0x10) & 0xff;
        uVar11 = (ulong)uVar13;
        ppauVar16 = local_120;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_03[0] = alVar17[1];
        Vec_06[1] = (longlong)ppauVar16;
        Vec_06[0] = uVar11;
        Prev_03[1] = uVar14;
        _scan_avx_d1(Vec_06,Prev_03);
        uVar13 = (uint)(uVar12 >> 8) & 0xff;
        uVar11 = (ulong)uVar13;
        ppauVar16 = local_120;
        local_168 = local_178;
        lStack_160 = lStack_170;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_04[0] = alVar17[1];
        Vec_07[1] = (longlong)ppauVar16;
        Vec_07[0] = uVar11;
        Prev_04[1] = uVar14;
        _scan_avx_d1(Vec_07,Prev_04);
        uVar14 = (ulong)(local_13c + 0x18U);
        local_158 = local_178;
        uStack_150 = lStack_170;
        if (local_130 < (int)(local_13c + 0x18U)) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                    local_130 - (local_13c + 0x10));
          return uVar9;
        }
        in_stack_fffffffffffffe60 = (uint8_t *)(uVar12 >> 0x10);
        uVar13 = (uint)(uVar12 >> 0x10) & 0xff;
        uVar11 = (ulong)uVar13;
        ppauVar16 = local_120;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_05[0] = alVar17[1];
        Vec_08[1] = (longlong)ppauVar16;
        Vec_08[0] = uVar11;
        Prev_05[1] = uVar14;
        _scan_avx_d1(Vec_08,Prev_05);
        uVar13 = (uint)((ulong)in_stack_fffffffffffffe60 >> 8) & 0xff;
        uVar11 = (ulong)uVar13;
        ppauVar16 = local_120;
        local_168 = local_178;
        lStack_160 = lStack_170;
        alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
        Prev_06[0] = alVar17[1];
        Vec_09[1] = (longlong)ppauVar16;
        Vec_09[0] = uVar11;
        Prev_06[1] = uVar14;
        alVar17 = _scan_avx_d1(Vec_09,Prev_06);
        palVar15 = alVar17[1];
        uVar13 = local_13c + 0x20;
        local_158 = local_178;
        uStack_150 = lStack_170;
        if (local_130 < (int)uVar13) {
          uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                    local_130 - (local_13c + 0x18));
          return uVar9;
        }
      }
      local_13c = local_13c + 0x20;
      PrevLow_00 = (xmm_t *)(ulong)uVar13;
      in_stack_fffffffffffffe68 = in_stack_fffffffffffffe60;
      in_stack_fffffffffffffe60 = puVar18;
    }
    in_stack_fffffffffffffe70 = in_stack_fffffffffffffe60;
    if (in_stack_fffffffffffffe60 == (uint8_t *)0x0) {
      local_70 = local_120[0];
      local_d8 = vlddqu_avx(*local_120[0]);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_d8._0_8_;
      vpmovzxbw_avx(auVar4);
      Vec_10[1] = (longlong)&local_168;
      Vec_10[0] = (longlong)&local_158;
      _scan_16bit_avx_d1(Vec_10,palVar15,PrevLow_00);
      if (local_130 < (int)(local_13c + 8U)) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,local_130 - local_13c);
        return uVar9;
      }
      local_78 = (undefined1 (*) [16])(*local_120[0] + 8);
      local_e8 = vlddqu_avx(*local_78);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_e8._0_8_;
      vpmovzxbw_avx(auVar5);
      Vec_11[1] = (longlong)&local_168;
      Vec_11[0] = (longlong)&local_158;
      _scan_16bit_avx_d1(Vec_11,PrevHi_03,(xmm_t *)(ulong)(local_13c + 8U));
      if (local_130 < (int)(local_13c + 0x10U)) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                  local_130 - (local_13c + 8));
        return uVar9;
      }
      local_80 = local_120[0] + 1;
      local_f8 = vlddqu_avx(*local_80);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_f8._0_8_;
      vpmovzxbw_avx(auVar6);
      Vec_12[1] = (longlong)&local_168;
      Vec_12[0] = (longlong)&local_158;
      _scan_16bit_avx_d1(Vec_12,PrevHi_04,(xmm_t *)(ulong)(local_13c + 0x10U));
      if (local_130 < (int)(local_13c + 0x18U)) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                  local_130 - (local_13c + 0x10));
        return uVar9;
      }
      local_30 = (ulong *)(local_120[0][1] + 8);
      local_108 = *local_30;
      uStack_40 = 0;
      uStack_100 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_108;
      vpmovzxbw_avx(auVar7);
      Vec_13[1] = (longlong)&local_168;
      Vec_13[0] = (longlong)&local_158;
      local_48 = local_108;
      _scan_16bit_avx_d1(Vec_13,PrevHi_05,(xmm_t *)(ulong)(local_13c + 0x18U));
      if (local_130 < local_13c + 0x20) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                  local_130 - (local_13c + 0x18));
        return uVar9;
      }
      local_120[0] = local_120[0] + 2;
    }
    else {
      uVar13 = (uint)in_stack_fffffffffffffe60 & 0xff;
      uVar14 = (ulong)uVar13;
      ppauVar16 = local_120;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_07[0] = alVar17[1];
      Vec_14[1] = (longlong)ppauVar16;
      Vec_14[0] = uVar14;
      Prev_07[1] = (longlong)PrevLow_00;
      _scan_avx_d1(Vec_14,Prev_07);
      uVar13 = (uint)((ulong)in_stack_fffffffffffffe60 >> 8) & 0xff;
      uVar14 = (ulong)uVar13;
      ppauVar16 = local_120;
      local_168 = local_178;
      lStack_160 = lStack_170;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_08[0] = alVar17[1];
      Vec_15[1] = (longlong)ppauVar16;
      Vec_15[0] = uVar14;
      Prev_08[1] = (longlong)PrevLow_00;
      _scan_avx_d1(Vec_15,Prev_08);
      uVar14 = (ulong)(local_13c + 8U);
      local_158 = local_178;
      uStack_150 = lStack_170;
      if (local_130 < (int)(local_13c + 8U)) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,local_130 - local_13c);
        return uVar9;
      }
      uVar11 = (ulong)in_stack_fffffffffffffe60 >> 0x10;
      uVar13 = (uint)((ulong)in_stack_fffffffffffffe60 >> 0x10) & 0xff;
      uVar12 = (ulong)uVar13;
      ppauVar16 = local_120;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_09[0] = alVar17[1];
      Vec_16[1] = (longlong)ppauVar16;
      Vec_16[0] = uVar12;
      Prev_09[1] = uVar14;
      _scan_avx_d1(Vec_16,Prev_09);
      uVar13 = (uint)(uVar11 >> 8) & 0xff;
      uVar12 = (ulong)uVar13;
      ppauVar16 = local_120;
      local_168 = local_178;
      lStack_160 = lStack_170;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_10[0] = alVar17[1];
      Vec_17[1] = (longlong)ppauVar16;
      Vec_17[0] = uVar12;
      Prev_10[1] = uVar14;
      _scan_avx_d1(Vec_17,Prev_10);
      uVar14 = (ulong)(local_13c + 0x10U);
      local_158 = local_178;
      uStack_150 = lStack_170;
      if (local_130 < (int)(local_13c + 0x10U)) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                  local_130 - (local_13c + 8));
        return uVar9;
      }
      uVar12 = uVar11 >> 0x10;
      uVar13 = (uint)(uVar11 >> 0x10) & 0xff;
      uVar11 = (ulong)uVar13;
      ppauVar16 = local_120;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_11[0] = alVar17[1];
      Vec_18[1] = (longlong)ppauVar16;
      Vec_18[0] = uVar11;
      Prev_11[1] = uVar14;
      _scan_avx_d1(Vec_18,Prev_11);
      uVar13 = (uint)(uVar12 >> 8) & 0xff;
      uVar11 = (ulong)uVar13;
      ppauVar16 = local_120;
      local_168 = local_178;
      lStack_160 = lStack_170;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_12[0] = alVar17[1];
      Vec_19[1] = (longlong)ppauVar16;
      Vec_19[0] = uVar11;
      Prev_12[1] = uVar14;
      _scan_avx_d1(Vec_19,Prev_12);
      uVar14 = (ulong)(local_13c + 0x18U);
      local_158 = local_178;
      uStack_150 = lStack_170;
      if (local_130 < (int)(local_13c + 0x18U)) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                  local_130 - (local_13c + 0x10));
        return uVar9;
      }
      in_stack_fffffffffffffe60 = (uint8_t *)(uVar12 >> 0x10);
      uVar13 = (uint)(uVar12 >> 0x10) & 0xff;
      uVar11 = (ulong)uVar13;
      ppauVar16 = local_120;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_13[0] = alVar17[1];
      Vec_20[1] = (longlong)ppauVar16;
      Vec_20[0] = uVar11;
      Prev_13[1] = uVar14;
      _scan_avx_d1(Vec_20,Prev_13);
      uVar13 = (uint)((ulong)in_stack_fffffffffffffe60 >> 8) & 0xff;
      uVar11 = (ulong)uVar13;
      ppauVar16 = local_120;
      local_168 = local_178;
      lStack_160 = lStack_170;
      alVar17 = _decode_avx(uVar13,(uint8_t **)ppauVar16);
      Prev_14[0] = alVar17[1];
      Vec_21[1] = (longlong)ppauVar16;
      Vec_21[0] = uVar11;
      Prev_14[1] = uVar14;
      _scan_avx_d1(Vec_21,Prev_14);
      local_158 = local_178;
      uStack_150 = lStack_170;
      if (local_130 < local_13c + 0x20) {
        uVar9 = _extract_from_xmm((xmm_t *)&local_158,(xmm_t *)&local_168,
                                  local_130 - (local_13c + 0x18));
        return uVar9;
      }
    }
    local_13c = local_13c + 0x20;
    local_12c = uStack_150._4_4_;
  }
  lVar10 = local_138 - (local_138 & 7);
  uVar9 = svb_select_scalar_d1_init
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     (uint64_t)in_stack_fffffffffffffe60,(uint32_t)((ulong)lVar10 >> 0x20),
                     (int)lVar10);
  return uVar9;
}

Assistant:

uint32_t svb_select_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                uint64_t count, uint32_t prev, int slot) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  // make sure that the loop is run at least once
  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 8)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 16)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 8));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 24)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 16));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 32)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 24));

      consumedInts += 32;
    }

    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  uint32_t keysleft = count & 31;
  return svb_select_scalar_d1_init(keyPtr + consumedkeys, dataPtr, keysleft,
                                   prev, slot - consumedInts);
}